

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

bool __thiscall
GraphContigger::pop_error_bubbble
          (GraphContigger *this,GraphEditor *ge,NodeView *nv1,NodeView *nv2,
          PairedReadsDatastore *peds,int min_support,int max_noise,int snr,bool verbose)

{
  ulong uVar1;
  bool bVar2;
  vector<long,_std::allocator<long>_> *p;
  pointer pNVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  sgNodeID_t node;
  int iVar7;
  ulong uVar8;
  vector<NodeView,_std::allocator<NodeView>_> local_68;
  vector<LinkView,_std::allocator<LinkView>_> local_50;
  GraphEditor *local_38;
  
  bVar2 = NodeView::is_bubble_side(nv1);
  if (bVar2) {
    NodeView::parallels(&local_68,nv1);
    uVar1 = nv2->id;
    if ((local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
         super__Vector_impl_data._M_start)->id == uVar1) {
      uVar8 = nv1->id;
      uVar5 = -uVar8;
      if (0 < (long)uVar8) {
        uVar5 = uVar8;
      }
      uVar8 = -uVar1;
      if (0 < (long)uVar1) {
        uVar8 = uVar1;
      }
      operator_delete(local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
                            .super__Vector_impl_data._M_start);
      if (uVar5 <= uVar8) {
        NodeView::prev(&local_50,nv1);
        PairedReadsMapper::all_paths_fw
                  ((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)&local_68,&peds->mapper,
                   ((local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                     super__Vector_impl_data._M_start)->node_view).id,false,true);
        if (local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar6 = 0;
          iVar7 = 0;
          iVar4 = 0;
        }
        else {
          iVar4 = 0;
          iVar7 = 0;
          iVar6 = 0;
          pNVar3 = local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            if (*(long *)pNVar3->id == nv1->id) {
              iVar4 = iVar4 + 1;
            }
            else if (*(long *)pNVar3->id == nv2->id) {
              iVar6 = iVar6 + 1;
            }
            else {
              iVar7 = iVar7 + 1;
            }
            pNVar3 = (pointer)&pNVar3[1].dg;
          } while (pNVar3 != local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        }
        local_38 = ge;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&local_68);
        NodeView::next(&local_50,nv1);
        PairedReadsMapper::all_paths_fw
                  ((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)&local_68,&peds->mapper,
                   -((local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).id,false,true);
        if (local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            if (*(long *)(local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start)->id == -nv1->id) {
              iVar4 = iVar4 + 1;
            }
            else if (*(long *)(local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                               _M_impl.super__Vector_impl_data._M_start)->id == -nv2->id) {
              iVar6 = iVar6 + 1;
            }
            else {
              iVar7 = iVar7 + 1;
            }
            local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                           super__Vector_impl_data._M_start[1].dg;
          } while (local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&local_68);
        if (((min_support < iVar4) && (iVar7 + iVar6 < max_noise)) &&
           ((iVar7 + iVar6) * snr <= iVar4)) {
          node = nv2->id;
        }
        else {
          if (iVar6 <= min_support) {
            return false;
          }
          if (max_noise <= iVar4 + iVar7) {
            return false;
          }
          if (iVar6 < (iVar4 + iVar7) * snr) {
            return false;
          }
          node = nv1->id;
        }
        GraphEditor::queue_node_deletion(local_38,node);
        return true;
      }
    }
    else {
      operator_delete(local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  return false;
}

Assistant:

bool GraphContigger::pop_error_bubbble(GraphEditor& ge, NodeView &nv1, NodeView &nv2, PairedReadsDatastore& peds, int min_support, int max_noise, int snr, bool verbose) {
//    auto nv1(_nv1);
//    auto nv2(_nv2);
    if (!nv1.is_bubble_side()) return false;

    if (nv1.parallels()[0].node_id() != nv2.node_id() or std::abs(nv1.node_id())>std::abs(nv2.node_id())) return false;
    int v1=0;
    int v2=0;
    int vo=0;
    for (const auto&p: peds.mapper.all_paths_fw(nv1.prev()[0].node().node_id(), false)) {
        if (p[0] == nv1.node_id()){
            v1++;
        } else if (p[0] == nv2.node_id()) {
            v2++;
        } else{
            vo++;
        }
    }
    for (const auto &p: peds.mapper.all_paths_fw(-nv1.next()[0].node().node_id(), false)) {
        if (p[0] == -nv1.node_id()) {
            v1++;
        } else if (p[0] == -nv2.node_id()) {
            v2++;
        } else {
            vo++;
        }
    }
    if (v1>min_support and v2+vo<max_noise and v1>=snr*(v2+vo)) {
        ge.queue_node_deletion(nv2.node_id());
        return true;
    }
    if (v2>min_support and v1+vo<max_noise and v2>=snr*(v1+vo)) {
        ge.queue_node_deletion(nv1.node_id());
        return true;
    }
    return false;
}